

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<16>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  long *plVar1;
  long *plVar2;
  int index;
  RepeatedField<long> *array;
  uint32_t local_20;
  undefined4 local_1c;
  
  if (*field != 0) {
    local_20 = md->tag;
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_20,output);
    local_1c = *(undefined4 *)((long)field + 0x10);
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_1c,output);
    if (0 < *field) {
      index = 0;
      do {
        plVar2 = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
        plVar1 = (long *)output->ptr;
        *plVar1 = *plVar2;
        output->ptr = (uint8_t *)(plVar1 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}